

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::DelSomeItem(Map *this,short uid,int amount,Character *from)

{
  int iVar1;
  Character *pCVar2;
  bool bVar3;
  int iVar4;
  list<Character_*,_std::allocator<Character_*>_> *plVar5;
  _List_node_base *p_Var6;
  iterator it;
  PacketBuilder builder;
  
  if (-1 < amount) {
    it._M_node = (_List_node_base *)&this->items;
    do {
      it._M_node = (it._M_node)->_M_next;
      if (it._M_node == (_List_node_base *)&this->items) {
        return;
      }
      p_Var6 = it._M_node[1]._M_next;
    } while (*(short *)&p_Var6->_M_next != uid);
    iVar1 = *(int *)((long)&p_Var6->_M_next + 4);
    iVar4 = iVar1 - amount;
    if (iVar4 == 0 || iVar1 < amount) {
      DelItem(this,it,from);
      return;
    }
    *(int *)((long)&p_Var6->_M_next + 4) = iVar4;
    PacketBuilder::PacketBuilder(&builder,PACKET_ITEM,PACKET_REMOVE,2);
    PacketBuilder::AddShort(&builder,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
    plVar5 = &this->characters;
    p_Var6 = (_List_node_base *)plVar5;
    while (p_Var6 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var6->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar5) {
      pCVar2 = (Character *)p_Var6[1]._M_next;
      if (((from == (Character *)0x0) || (pCVar2 != from)) &&
         (bVar3 = Character::InRange(pCVar2,(Map_Item *)it._M_node[1]._M_next), bVar3)) {
        Character::Send(pCVar2,&builder);
      }
    }
    PacketBuilder::Reset(&builder,9);
    PacketBuilder::SetID(&builder,PACKET_ITEM,PACKET_ADD);
    PacketBuilder::AddShort(&builder,(int)*(short *)((long)&(it._M_node[1]._M_next)->_M_next + 2));
    PacketBuilder::AddShort(&builder,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
    PacketBuilder::AddThree(&builder,*(int *)((long)&(it._M_node[1]._M_next)->_M_next + 4));
    PacketBuilder::AddChar(&builder,(uint)*(byte *)&(it._M_node[1]._M_next)->_M_prev);
    PacketBuilder::AddChar(&builder,(uint)*(byte *)((long)&(it._M_node[1]._M_next)->_M_prev + 1));
    p_Var6 = (_List_node_base *)plVar5;
    while (p_Var6 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var6->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar5) {
      pCVar2 = (Character *)p_Var6[1]._M_next;
      bVar3 = Character::InRange(pCVar2,(Map_Item *)it._M_node[1]._M_next);
      if (bVar3) {
        Character::Send(pCVar2,&builder);
      }
    }
    PacketBuilder::~PacketBuilder(&builder);
  }
  return;
}

Assistant:

void Map::DelSomeItem(short uid, int amount, Character *from)
{
	if (amount < 0)
		return;

	UTIL_IFOREACH(this->items, it)
	{
		if ((*it)->uid == uid)
		{
			if (amount < (*it)->amount)
			{
				(*it)->amount -= amount;

				PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
				builder.AddShort((*it)->uid);

				UTIL_FOREACH(this->characters, character)
				{
					if ((from && character == from) || !character->InRange(**it))
					{
						continue;
					}

					character->Send(builder);
				}

				builder.Reset(9);
				builder.SetID(PACKET_ITEM, PACKET_ADD);
				builder.AddShort((*it)->id);
				builder.AddShort((*it)->uid);
				builder.AddThree((*it)->amount);
				builder.AddChar((*it)->x);
				builder.AddChar((*it)->y);

				UTIL_FOREACH(this->characters, character)
				{
					if (!character->InRange(**it))
						continue;

					character->Send(builder);
				}
			}
			else
			{
				this->DelItem(it, from);
			}

			break;
		}
	}
}